

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O3

void __thiscall
ON_Annotation::SetTextVerticalAlignment
          (ON_Annotation *this,ON_DimStyle *parent_style,TextVerticalAlignment value)

{
  TextVerticalAlignment TVar1;
  ON_DimStyle *pOVar2;
  
  pOVar2 = ON_DimStyle::DimStyleOrDefault(parent_style);
  TVar1 = ON_DimStyle::TextVerticalAlignment(pOVar2);
  pOVar2 = Internal_GetOverrideStyle(this,TVar1 != value);
  if (pOVar2 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetTextVerticalAlignment(pOVar2,value);
    ON_DimStyle::SetFieldOverride(pOVar2,TextVerticalAlignment,TVar1 != value);
    return;
  }
  return;
}

Assistant:

void ON_Annotation::SetTextVerticalAlignment(const ON_DimStyle* parent_style, ON::TextVerticalAlignment value)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = (value != parent_style->TextVerticalAlignment());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetTextVerticalAlignment(value);
    override_style->SetFieldOverride(ON_DimStyle::field::TextVerticalAlignment, bCreate);
  }
}